

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall
SolutionWriterTest_WriteFeasibleSolutions_Test::~SolutionWriterTest_WriteFeasibleSolutions_Test
          (SolutionWriterTest_WriteFeasibleSolutions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SolutionWriterTest, WriteFeasibleSolutions) {
  SolCountingSolver solver(true);
  solver.SetStrOption("solutionstub", "foo");
  typedef SolCountingSolver::ProblemBuilder ProblemBuilder;
  ProblemBuilder problem_builder;
  typedef StrictMock<MockSolWriter<ProblemBuilder> > SolWriter;
  mp::SolutionWriter<SolCountingSolver, SolWriter>
      writer("test", solver, problem_builder);
  SolWriter &sol_writer = writer.sol_writer();
  int nsol = 5;
  for (int i = 0; i < nsol; ++i) {
    std::string filename = fmt::format("foo{}.sol", i + 1);
    EXPECT_CALL(sol_writer, Write(StringRefEq(filename), _));
    writer.HandleFeasibleSolution("", 0, 0, 0);
  }
  EXPECT_CALL(sol_writer, Write(_, MatchNSol(nsol)));
  writer.HandleSolution(0, "", 0, 0, 0);
}